

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringTest.cpp
# Opt level: O1

void __thiscall StringTest::Run(StringTest *this)

{
  switch(this->mTestNum) {
  case 0:
    Test1(this);
    return;
  case 1:
    Test2(this);
    return;
  case 2:
    Test3(this);
    return;
  case 3:
    Test4(this);
    return;
  case 4:
    Test5(this);
    return;
  case 5:
    Test6(this);
    return;
  case 6:
    Test7(this);
    return;
  case 7:
    Test8(this);
    return;
  case 8:
    Test9(this);
    return;
  case 9:
    Test10(this);
    return;
  case 10:
    Test11(this);
    return;
  case 0xb:
    Test12(this);
    return;
  default:
    return;
  }
}

Assistant:

void Run()
	{	
		switch( mTestNum )
		{
		case 0:
			Test1();
			break;
		case 1:
			Test2();
			break;
		case 2:
			Test3();
			break;
		case 3:
			Test4();
			break;
		case 4:
			Test5();
			break;
		case 5:
			Test6();
			break;
		case 6:
			Test7();
			break;
		case 7:
			Test8();
			break;
		case 8:
			Test9();
			break;
		case 9:
			Test10();
			break;
		case 10:
			Test11();
			break;
		case 11:
			Test12();
			break;
		default:
			break;
		}
	}